

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O2

HelicsApp helicsCreateApp(char *appName,char *appType,char *configFile,HelicsFederateInfo fedInfo,
                         HelicsError *err)

{
  size_type sVar1;
  ConfigType CVar2;
  char *pcVar3;
  char *pcVar4;
  FederateInfo *pFVar5;
  _Alloc_hider fedInfo_00;
  _Head_base<0UL,_helics::AppObject_*,_false> _Var6;
  string_view configString;
  string_view type;
  string_view type_00;
  string_view appName_00;
  string_view appName_01;
  __single_object app;
  unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> local_210;
  string cstring;
  __shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  FederateInfo newFedInfo;
  
  if ((err != (HelicsError *)0x0) && (err->error_code != 0)) {
    return (AppObject *)(_Head_base<0UL,_helics::AppObject_*,_false>)0x0;
  }
  if (configFile == (char *)0x0) {
    std::__cxx11::string::string((string *)&cstring,&gHelicsEmptyStr_abi_cxx11_);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cstring,configFile,(allocator<char> *)&newFedInfo);
  }
  std::make_unique<helics::AppObject>();
  *(undefined4 *)
   ((long)app._M_t.super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>
          ._M_t.super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>
          .super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl + 0x34) = 0x7a8f1c4d;
  pcVar3 = (char *)gHelicsEmptyStr_abi_cxx11_._M_string_length;
  fedInfo_00 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
  if (appName != (char *)0x0) {
    pcVar3 = (char *)strlen(appName);
    fedInfo_00._M_p = appName;
  }
  if (appType == (char *)0x0) {
LAB_0018f267:
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      err->message = 
      "app type must be one of \'connector\', \'source\',\'recorder\',\'player\',\'echo\',\'clone\',\'probe\',\'tracer\'"
      ;
    }
LAB_0018f27d:
    _Var6._M_head_impl = (AppObject *)0x0;
  }
  else {
    pcVar4 = (char *)strlen(appType);
    sVar1 = cstring._M_string_length;
    if ((fedInfo == (HelicsFederateInfo)0x0) &&
       (configString._M_str = cstring._M_dataplus._M_p,
       configString._M_len = cstring._M_string_length,
       CVar2 = helics::fileops::getConfigType(configString), CVar2 != NONE)) {
      helics::loadFederateInfo(&newFedInfo,(string *)&cstring);
      type_00._M_str = pcVar4;
      type_00._M_len = (size_t)&local_1e8;
      appName_01._M_str = pcVar3;
      appName_01._M_len = (size_t)appType;
      anon_unknown.dwarf_ef4e5::buildApp(type_00,appName_01,(FederateInfo *)fedInfo_00._M_p);
      std::__shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)app._M_t.
                        super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>
                        .super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl + 0x20),
                 &local_1e8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
      helics::FederateInfo::~FederateInfo(&newFedInfo);
      if (*(long *)((long)app._M_t.
                          super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>
                          .super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl + 0x20) ==
          0) goto LAB_0018f267;
    }
    else {
      pFVar5 = getFedInfo(fedInfo,err);
      if (pFVar5 == (FederateInfo *)0x0) goto LAB_0018f27d;
      type._M_str = pcVar4;
      type._M_len = (size_t)&newFedInfo;
      appName_00._M_str = pcVar3;
      appName_00._M_len = (size_t)appType;
      anon_unknown.dwarf_ef4e5::buildApp(type,appName_00,(FederateInfo *)fedInfo_00._M_p);
      std::__shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)app._M_t.
                        super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>
                        .super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl + 0x20),
                 (__shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2> *)&newFedInfo);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &newFedInfo.super_CoreFederateInfo.timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      if (*(App **)((long)app._M_t.
                          super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>
                          .super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl + 0x20) ==
          (App *)0x0) goto LAB_0018f267;
      if ((sVar1 != 0) && (cstring._M_string_length != 0)) {
        helics::apps::App::loadFile
                  (*(App **)((long)app._M_t.
                                   super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>
                                   .super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl +
                            0x20),(string *)&cstring,true);
      }
    }
    _Var6._M_head_impl =
         (AppObject *)
         app._M_t.super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>.
         _M_t.super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
         super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl;
    getMasterHolder();
    local_210._M_t.super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>
    ._M_t.super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
    super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl =
         app._M_t.super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>.
         _M_t.super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
         super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl;
    app._M_t.super___uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>._M_t.
    super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
    super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl =
         (__uniq_ptr_data<helics::AppObject,_std::default_delete<helics::AppObject>,_true,_true>)
         (__uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_>)0x0;
    MasterObjectHolder::addApp
              ((MasterObjectHolder *)
               newFedInfo.super_CoreFederateInfo.timeProps.
               super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,&local_210);
    std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::~unique_ptr
              (&local_210);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &newFedInfo.super_CoreFederateInfo.timeProps.
                super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::~unique_ptr(&app);
  std::__cxx11::string::~string((string *)&cstring);
  return (AppObject *)
         (_Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>)
         _Var6._M_head_impl;
}

Assistant:

HelicsApp helicsCreateApp(const char* appName, const char* appType, const char* configFile, HelicsFederateInfo fedInfo, HelicsError* err)
{
    static constexpr const char* invalidAppTypeString =
        "app type must be one of 'connector', 'source','recorder','player','echo','clone','probe','tracer'";
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }

    try {
        auto cstring = AS_STRING(configFile);
        auto app = std::make_unique<helics::AppObject>();
        app->valid = helics::appValidationIdentifier;
        auto nstring = AS_STRING_VIEW(appName);
        if (appType == nullptr) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidAppTypeString);
            return nullptr;
        }

        const std::string_view appTypeName(appType);
        bool loadFile = !cstring.empty();
        if (fedInfo == nullptr && helics::fileops::getConfigType(cstring) != helics::fileops::ConfigType::NONE) {
            helics::FederateInfo newFedInfo = helics::loadFederateInfo(cstring);
            app->app = buildApp(appTypeName, nstring, newFedInfo);
            loadFile = false;
        } else {
            auto* info = getFedInfo(fedInfo, err);
            if (info == nullptr) {
                return nullptr;
            }
            app->app = buildApp(appTypeName, nstring, *info);
        }

        if (!app->app) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidAppTypeString);
            return nullptr;
        }
        if (loadFile && !cstring.empty()) {
            app->app->loadFile(cstring);
        }
        auto* retapp = reinterpret_cast<HelicsApp>(app.get());
        getMasterHolder()->addApp(std::move(app));
        return retapp;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}